

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::I_formatter<spdlog::details::scoped_padder>::format
          (I_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  int iVar1;
  int n;
  scoped_padder p;
  
  scoped_padder::scoped_padder(&p,2,&(this->super_flag_formatter).padinfo_,dest);
  iVar1 = tm_time->tm_hour;
  n = iVar1 + -0xc;
  if (iVar1 < 0xd) {
    n = iVar1;
  }
  fmt_helper::pad2(n,dest);
  scoped_padder::~scoped_padder(&p);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(to12h(tm_time), dest);
    }